

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_39db::TlbExportVisitor::visit_(TlbExportVisitor *this,Pointer *type)

{
  ostream *poVar1;
  TlbExportVisitor local_68 [48];
  TlbExportVisitor local_38 [32];
  Indirect *local_18;
  Pointer *type_local;
  TlbExportVisitor *this_local;
  
  local_18 = (Indirect *)type;
  type_local = (Pointer *)this;
  std::operator<<(this->m_stream,"<pointer ");
  indirect(this->m_stream,local_18);
  poVar1 = std::operator<<(this->m_stream," ");
  (anonymous_namespace)::TlbExportVisitor::emitSourceID_abi_cxx11_(local_38);
  poVar1 = std::operator<<(poVar1,(string *)local_38);
  std::operator<<(poVar1,">\n");
  std::__cxx11::string::~string((string *)local_38);
  poVar1 = std::operator<<(this->m_stream,(string *)&this->m_indent);
  (anonymous_namespace)::TlbExportVisitor::emitMetaData_abi_cxx11_(local_68,(Type *)this);
  poVar1 = std::operator<<(poVar1,(string *)local_68);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)local_68);
  poVar1 = std::operator<<(this->m_stream,(string *)&this->m_indent);
  std::operator<<(poVar1,"</pointer>");
  return true;
}

Assistant:

bool TlbExportVisitor::visit_ (Pointer const& type)
    {
        m_stream << "<pointer ";
        indirect(m_stream, type);
        m_stream << " " << emitSourceID() << ">\n";
        m_stream << m_indent << emitMetaData(type) << "\n";
        m_stream << m_indent << "</pointer>";
        return true;
    }